

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O3

void __thiscall
svg::Text::Text(Text *this,Point *origin,string *content,Fill *fill,Font *font,Stroke *stroke)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined3 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  (this->super_Shape).super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Shape_0010eb90;
  (this->super_Shape).fill.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Fill_0010ebc0;
  (this->super_Shape).fill.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_0010eaa0;
  uVar5 = *(undefined3 *)&(fill->color).field_0x9;
  iVar6 = (fill->color).red;
  iVar7 = (fill->color).green;
  iVar8 = (fill->color).blue;
  (this->super_Shape).fill.color.transparent = (fill->color).transparent;
  *(undefined3 *)&(this->super_Shape).fill.color.field_0x9 = uVar5;
  (this->super_Shape).fill.color.red = iVar6;
  (this->super_Shape).fill.color.green = iVar7;
  (this->super_Shape).fill.color.blue = iVar8;
  (this->super_Shape).stroke.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Stroke_0010eaf0;
  (this->super_Shape).stroke.width = stroke->width;
  (this->super_Shape).stroke.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_0010eaa0;
  uVar5 = *(undefined3 *)&(stroke->color).field_0x9;
  iVar6 = (stroke->color).red;
  iVar7 = (stroke->color).green;
  iVar8 = (stroke->color).blue;
  (this->super_Shape).stroke.color.transparent = (stroke->color).transparent;
  *(undefined3 *)&(this->super_Shape).stroke.color.field_0x9 = uVar5;
  (this->super_Shape).stroke.color.red = iVar6;
  (this->super_Shape).stroke.color.green = iVar7;
  (this->super_Shape).stroke.color.blue = iVar8;
  (this->super_Shape).stroke.nonScaling = stroke->nonScaling;
  (this->super_Shape).super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Text_0010ed18;
  uVar2 = *(undefined4 *)((long)&origin->x + 4);
  uVar3 = *(undefined4 *)&origin->y;
  uVar4 = *(undefined4 *)((long)&origin->y + 4);
  *(undefined4 *)&(this->origin).x = *(undefined4 *)&origin->x;
  *(undefined4 *)((long)&(this->origin).x + 4) = uVar2;
  *(undefined4 *)&(this->origin).y = uVar3;
  *(undefined4 *)((long)&(this->origin).y + 4) = uVar4;
  (this->content)._M_dataplus._M_p = (pointer)&(this->content).field_2;
  pcVar1 = (content->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->content,pcVar1,pcVar1 + content->_M_string_length);
  (this->font).super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Font_0010ecd8;
  (this->font).size = font->size;
  (this->font).family._M_dataplus._M_p = (pointer)&(this->font).family.field_2;
  pcVar1 = (font->family)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->font).family,pcVar1,pcVar1 + (font->family)._M_string_length);
  return;
}

Assistant:

Text(Point const & origin, std::string const & content, Fill const & fill = Fill(),
             Font const & font = Font(), Stroke const & stroke = Stroke())
            : Shape(fill, stroke), origin(origin), content(content), font(font) { }